

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic13::Run(UnitTest_semantic13 *this)

{
  long *local_60;
  string local_58;
  allocator local_31;
  long *local_30;
  long *local_28;
  long *local_20;
  
  std::__cxx11::string::string((string *)&local_58,"a = -#{1, 2, 3} + 1",&local_31);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_60,&local_58);
  if (local_60 == (long *)0x0) {
    local_60 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string
              ((string *)&local_58,"\'Semantic(\"a = -#{1, 2, 3} + 1\")\'",(allocator *)&local_60);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_58);
  }
  else {
    (**(code **)(*local_60 + 8))();
    local_60 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"a = (1 > 2) + 1",(allocator *)&local_60);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_20,&local_58);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  local_20 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,
             "\'{ Semantic(\"a = (1 > 2) + 1\"); }\' has no luna::SemanticException",
             (allocator *)&local_60);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"a = (1 ~= 2) > 1",(allocator *)&local_60);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_28,&local_58);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,
             "\'{ Semantic(\"a = (1 ~= 2) > 1\"); }\' has no luna::SemanticException",
             (allocator *)&local_60);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"a = not a >= true",(allocator *)&local_60);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_30,&local_58);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  local_30 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,
             "\'{ Semantic(\"a = not a >= true\"); }\' has no luna::SemanticException",
             (allocator *)&local_60);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TEST_CASE(semantic13)
{
    EXPECT_TRUE(Semantic("a = -#{1, 2, 3} + 1"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 > 2) + 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = (1 ~= 2) > 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = not a >= true");
    });
}